

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O3

void __thiscall
kainjow::mustache::
basic_mustache<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
::render_section(basic_mustache<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                 *this,render_handler *handler,
                context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                *ctx,component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                     *incomp,
                basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                *var)

{
  vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  *pvVar1;
  pointer pcVar2;
  context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *pcVar3;
  render_handler *prVar4;
  walk_control wVar5;
  pointer pbVar6;
  component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *child;
  pointer pcVar7;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *local_48;
  render_handler *local_40;
  pointer local_38;
  
  if (var == (basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              *)0x0) {
    (ctx->line_buffer).contained_section_tag = true;
    local_68._8_8_ = 0;
    local_68._M_unused._M_object = operator_new(0x18);
    *(render_handler **)local_68._M_unused._0_8_ = handler;
    *(context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      **)((long)local_68._M_unused._0_8_ + 8) = ctx;
    *(basic_mustache<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      **)((long)local_68._M_unused._0_8_ + 0x10) = this;
    local_50 = Catch::clara::std::
               _Function_handler<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::walk_control_(kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:1134:31)>
               ::_M_invoke;
    local_58 = Catch::clara::std::
               _Function_handler<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::walk_control_(kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:1134:31)>
               ::_M_manager;
    pcVar7 = (incomp->children).
             super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar2 = (incomp->children).
             super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pcVar7 != pcVar2) {
      do {
        wVar5 = component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                ::walk(pcVar7,(walk_callback *)&local_68);
        if (wVar5 != walk) break;
        pcVar7 = pcVar7 + 1;
      } while (pcVar7 != pcVar2);
      if (local_58 == (code *)0x0) goto LAB_001e5736;
    }
    (*local_58)(&local_68,&local_68,__destroy_functor);
LAB_001e5736:
    (ctx->line_buffer).contained_section_tag = true;
    return;
  }
  local_48 = ctx;
  if (var->type_ == list) {
    pvVar1 = (var->list_)._M_t.
             super___uniq_ptr_impl<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>,_std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_*,_std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>_>
             .
             super__Head_base<0UL,_std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_*,_false>
             ._M_head_impl;
    pbVar6 = *(pointer *)
              &(pvVar1->
               super__Vector_base<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
               )._M_impl;
    local_38 = (pvVar1->
               super__Vector_base<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    local_40 = handler;
    if (pbVar6 != local_38) {
      do {
        prVar4 = local_40;
        pcVar3 = local_48;
        (local_48->line_buffer).contained_section_tag = true;
        (*local_48->ctx->_vptr_basic_context[2])(local_48->ctx,pbVar6);
        local_68._8_8_ = 0;
        local_68._M_unused._M_object = operator_new(0x18);
        *(render_handler **)local_68._M_unused._0_8_ = prVar4;
        *(context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          **)((long)local_68._M_unused._0_8_ + 8) = pcVar3;
        *(basic_mustache<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          **)((long)local_68._M_unused._0_8_ + 0x10) = this;
        local_50 = Catch::clara::std::
                   _Function_handler<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::walk_control_(kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:1134:31)>
                   ::_M_invoke;
        local_58 = Catch::clara::std::
                   _Function_handler<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::walk_control_(kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:1134:31)>
                   ::_M_manager;
        pcVar7 = (incomp->children).
                 super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar2 = (incomp->children).
                 super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pcVar7 == pcVar2) {
LAB_001e55d1:
          (*local_58)(&local_68,&local_68,__destroy_functor);
        }
        else {
          do {
            wVar5 = component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                    ::walk(pcVar7,(walk_callback *)&local_68);
            if (wVar5 != walk) break;
            pcVar7 = pcVar7 + 1;
          } while (pcVar7 != pcVar2);
          if (local_58 != (code *)0x0) goto LAB_001e55d1;
        }
        (local_48->line_buffer).contained_section_tag = true;
        (*local_48->ctx->_vptr_basic_context[3])();
        pbVar6 = pbVar6 + 1;
        if (pbVar6 == local_38) {
          return;
        }
      } while( true );
    }
  }
  (ctx->line_buffer).contained_section_tag = true;
  (*ctx->ctx->_vptr_basic_context[2])(ctx->ctx,var);
  local_68._8_8_ = 0;
  local_68._M_unused._M_object = operator_new(0x18);
  *(render_handler **)local_68._M_unused._0_8_ = handler;
  *(context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    **)((long)local_68._M_unused._0_8_ + 8) = ctx;
  *(basic_mustache<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    **)((long)local_68._M_unused._0_8_ + 0x10) = this;
  local_50 = Catch::clara::std::
             _Function_handler<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::walk_control_(kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:1134:31)>
             ::_M_invoke;
  local_58 = Catch::clara::std::
             _Function_handler<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::walk_control_(kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:1134:31)>
             ::_M_manager;
  pcVar7 = (incomp->children).
           super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (incomp->children).
           super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pcVar7 != pcVar2) {
    do {
      wVar5 = component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              ::walk(pcVar7,(walk_callback *)&local_68);
      if (wVar5 != walk) break;
      pcVar7 = pcVar7 + 1;
    } while (pcVar7 != pcVar2);
    if (local_58 == (code *)0x0) goto LAB_001e56a2;
  }
  (*local_58)(&local_68,&local_68,__destroy_functor);
LAB_001e56a2:
  (ctx->line_buffer).contained_section_tag = true;
  (*ctx->ctx->_vptr_basic_context[3])();
  return;
}

Assistant:

void render_section(const render_handler& handler, context_internal<string_type>& ctx, component<string_type>& incomp, const basic_data<string_type>* var) {
        const auto callback = [&handler, &ctx, this](component<string_type>& comp) -> typename component<string_type>::walk_control {
            return render_component(handler, ctx, comp);
        };
        if (var && var->is_non_empty_list()) {
            for (const auto& item : var->list_value()) {
                // account for the section begin tag
                ctx.line_buffer.contained_section_tag = true;

                const context_pusher<string_type> ctxpusher{ctx, &item};
                incomp.walk_children(callback);

                // ctx may have been cleared. account for the section end tag
                ctx.line_buffer.contained_section_tag = true;
            }
        } else if (var) {
            // account for the section begin tag
            ctx.line_buffer.contained_section_tag = true;

            const context_pusher<string_type> ctxpusher{ctx, var};
            incomp.walk_children(callback);

            // ctx may have been cleared. account for the section end tag
            ctx.line_buffer.contained_section_tag = true;
        } else {
            // account for the section begin tag
            ctx.line_buffer.contained_section_tag = true;

            incomp.walk_children(callback);

            // ctx may have been cleared. account for the section end tag
            ctx.line_buffer.contained_section_tag = true;
        }
    }